

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O0

void SmoothSegmentMap(VP8Encoder *enc)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  long in_RDI;
  VP8MBInfo *mb_1;
  int majority_seg;
  VP8MBInfo *mb;
  int cnt [4];
  uint8_t *tmp;
  int majority_cnt_3_x_3_grid;
  int h;
  int w;
  int y;
  int x;
  int n;
  size_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar4;
  int local_38 [4];
  void *local_28;
  undefined4 local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  uint local_c;
  long local_8;
  
  local_18 = *(int *)(in_RDI + 0x30);
  local_1c = *(int *)(in_RDI + 0x34);
  local_20 = 5;
  local_8 = in_RDI;
  local_28 = WebPSafeMalloc(CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            in_stack_ffffffffffffffb0);
  if (local_28 != (void *)0x0) {
    for (local_14 = 1; local_14 < local_1c + -1; local_14 = local_14 + 1) {
      for (local_10 = 1; local_10 < local_18 + -1; local_10 = local_10 + 1) {
        memset(local_38,0,0x10);
        pbVar3 = (byte *)(*(long *)(local_8 + 0x5c60) + (long)(local_10 + local_18 * local_14) * 4);
        bVar1 = *pbVar3;
        bVar2 = pbVar3[(long)(-1 - local_18) * 4] >> 5 & 3;
        local_38[bVar2] = local_38[bVar2] + 1;
        bVar2 = pbVar3[(long)-local_18 * 4] >> 5 & 3;
        local_38[bVar2] = local_38[bVar2] + 1;
        bVar2 = pbVar3[(long)(1 - local_18) * 4] >> 5 & 3;
        local_38[bVar2] = local_38[bVar2] + 1;
        bVar2 = pbVar3[-4] >> 5 & 3;
        local_38[bVar2] = local_38[bVar2] + 1;
        bVar2 = pbVar3[4] >> 5 & 3;
        local_38[bVar2] = local_38[bVar2] + 1;
        bVar2 = pbVar3[(long)(local_18 + -1) * 4] >> 5 & 3;
        local_38[bVar2] = local_38[bVar2] + 1;
        bVar2 = pbVar3[(long)local_18 * 4] >> 5 & 3;
        local_38[bVar2] = local_38[bVar2] + 1;
        bVar2 = pbVar3[(long)(local_18 + 1) * 4] >> 5 & 3;
        local_38[bVar2] = local_38[bVar2] + 1;
        for (local_c = 0;
            (uVar4 = (uint)(bVar1 >> 5 & 3), (int)local_c < 4 &&
            (uVar4 = local_c, local_38[(int)local_c] < 5)); local_c = local_c + 1) {
        }
        *(char *)((long)local_28 + (long)(local_10 + local_14 * local_18)) = (char)uVar4;
      }
    }
    for (local_14 = 1; local_14 < local_1c + -1; local_14 = local_14 + 1) {
      for (local_10 = 1; local_10 < local_18 + -1; local_10 = local_10 + 1) {
        pbVar3 = (byte *)(*(long *)(local_8 + 0x5c60) + (long)(local_10 + local_18 * local_14) * 4);
        *pbVar3 = *pbVar3 & 0x9f |
                  (*(byte *)((long)local_28 + (long)(local_10 + local_14 * local_18)) & 3) << 5;
      }
    }
    WebPSafeFree((void *)0x17190b);
  }
  return;
}

Assistant:

static void SmoothSegmentMap(VP8Encoder* const enc) {
  int n, x, y;
  const int w = enc->mb_w_;
  const int h = enc->mb_h_;
  const int majority_cnt_3_x_3_grid = 5;
  uint8_t* const tmp = (uint8_t*)WebPSafeMalloc(w * h, sizeof(*tmp));
  assert((uint64_t)(w * h) == (uint64_t)w * h);   // no overflow, as per spec

  if (tmp == NULL) return;
  for (y = 1; y < h - 1; ++y) {
    for (x = 1; x < w - 1; ++x) {
      int cnt[NUM_MB_SEGMENTS] = { 0 };
      const VP8MBInfo* const mb = &enc->mb_info_[x + w * y];
      int majority_seg = mb->segment_;
      // Check the 8 neighbouring segment values.
      cnt[mb[-w - 1].segment_]++;  // top-left
      cnt[mb[-w + 0].segment_]++;  // top
      cnt[mb[-w + 1].segment_]++;  // top-right
      cnt[mb[   - 1].segment_]++;  // left
      cnt[mb[   + 1].segment_]++;  // right
      cnt[mb[ w - 1].segment_]++;  // bottom-left
      cnt[mb[ w + 0].segment_]++;  // bottom
      cnt[mb[ w + 1].segment_]++;  // bottom-right
      for (n = 0; n < NUM_MB_SEGMENTS; ++n) {
        if (cnt[n] >= majority_cnt_3_x_3_grid) {
          majority_seg = n;
          break;
        }
      }
      tmp[x + y * w] = majority_seg;
    }
  }
  for (y = 1; y < h - 1; ++y) {
    for (x = 1; x < w - 1; ++x) {
      VP8MBInfo* const mb = &enc->mb_info_[x + w * y];
      mb->segment_ = tmp[x + y * w];
    }
  }
  WebPSafeFree(tmp);
}